

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Step_bound_info_patch
               (int g_xx,int *xxlo,int *xxhi,int g_vv,int *vvlo,int *vvhi,int g_xxll,int *xxlllo,
               int *xxllhi,int g_xxuu,int *xxuulo,int *xxuuhi,void *boundmin,void *wolfemin,
               void *boundmax)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_xxuuhi [7];
  Integer _ga_xxuulo [7];
  Integer _ga_xxllhi [7];
  Integer _ga_xxlllo [7];
  Integer _ga_vvhi [7];
  Integer _ga_vvlo [7];
  Integer _ga_xxhi [7];
  Integer in_stack_00000228;
  Integer _ga_xxlo [7];
  Integer *in_stack_00000268;
  Integer ndim;
  Integer xxuu;
  Integer xxll;
  Integer vv;
  Integer xx;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  long local_288 [8];
  long local_248 [8];
  long local_208 [8];
  long local_1c8 [8];
  long local_188 [8];
  long local_148 [8];
  long local_108;
  Integer in_stack_ffffffffffffff00;
  long local_c8 [8];
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_48;
  long local_40;
  
  local_68 = (long)in_EDI;
  local_70 = (long)in_ECX;
  local_78 = (long)in_stack_00000008;
  local_80 = (long)in_stack_00000020;
  local_60 = in_R9;
  local_58 = in_R8;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_88 = pnga_ndim(in_stack_ffffffffffffff00);
  for (local_28c = 0; local_28c < local_88; local_28c = local_28c + 1) {
    local_c8[(local_88 - local_28c) + -1] = (long)*(int *)(local_40 + (long)local_28c * 4) + 1;
  }
  for (local_290 = 0; local_290 < local_88; local_290 = local_290 + 1) {
    (&local_108)[(local_88 - local_290) + -1] = (long)*(int *)(local_48 + (long)local_290 * 4) + 1;
  }
  for (local_294 = 0; local_294 < local_88; local_294 = local_294 + 1) {
    local_148[(local_88 - local_294) + -1] = (long)*(int *)(local_58 + (long)local_294 * 4) + 1;
  }
  for (local_298 = 0; local_298 < local_88; local_298 = local_298 + 1) {
    local_188[(local_88 - local_298) + -1] = (long)*(int *)(local_60 + (long)local_298 * 4) + 1;
  }
  for (local_29c = 0; local_29c < local_88; local_29c = local_29c + 1) {
    local_1c8[(local_88 - local_29c) + -1] =
         (long)*(int *)(in_stack_00000010 + (long)local_29c * 4) + 1;
  }
  for (local_2a0 = 0; local_2a0 < local_88; local_2a0 = local_2a0 + 1) {
    local_208[(local_88 - local_2a0) + -1] =
         (long)*(int *)(in_stack_00000018 + (long)local_2a0 * 4) + 1;
  }
  for (local_2a4 = 0; local_2a4 < local_88; local_2a4 = local_2a4 + 1) {
    local_248[(local_88 - local_2a4) + -1] =
         (long)*(int *)(in_stack_00000028 + (long)local_2a4 * 4) + 1;
  }
  for (local_2a8 = 0; local_2a8 < local_88; local_2a8 = local_2a8 + 1) {
    local_288[(local_88 - local_2a8) + -1] =
         (long)*(int *)(in_stack_00000030 + (long)local_2a8 * 4) + 1;
  }
  pnga_step_bound_info_patch
            (_ga_xxlo[2],(Integer *)_ga_xxlo[1],(Integer *)_ga_xxlo[0],in_stack_00000228,
             (Integer *)_ga_xxhi[6],(Integer *)_ga_xxhi[5],_ga_xxlo[6],in_stack_00000268,
             (Integer *)ndim,xxuu,(Integer *)xxll,(Integer *)vv,(void *)xx,vvhi,vvlo);
  return;
}

Assistant:

void GA_Step_bound_info_patch(int g_xx, int xxlo[], int xxhi[],  int g_vv, int vvlo[], int vvhi[], int g_xxll, int xxlllo[], int xxllhi[], int g_xxuu,  int xxuulo[], int xxuuhi[], void *boundmin, void *wolfemin, void *boundmax)
{
    Integer xx = (Integer)g_xx;
    Integer vv = (Integer)g_vv;
    Integer xxll = (Integer)g_xxll;
    Integer xxuu = (Integer)g_xxuu;
    Integer ndim = wnga_ndim(xx);
    Integer _ga_xxlo[MAXDIM], _ga_xxhi[MAXDIM];
    Integer _ga_vvlo[MAXDIM], _ga_vvhi[MAXDIM];
    Integer _ga_xxlllo[MAXDIM], _ga_xxllhi[MAXDIM];
    Integer _ga_xxuulo[MAXDIM], _ga_xxuuhi[MAXDIM];
    COPYINDEX_C2F(xxlo,_ga_xxlo, ndim);
    COPYINDEX_C2F(xxhi,_ga_xxhi, ndim);
    COPYINDEX_C2F(vvlo,_ga_vvlo, ndim);
    COPYINDEX_C2F(vvhi,_ga_vvhi, ndim);
    COPYINDEX_C2F(xxlllo,_ga_xxlllo, ndim);
    COPYINDEX_C2F(xxllhi,_ga_xxllhi, ndim);
    COPYINDEX_C2F(xxuulo,_ga_xxuulo, ndim);
    COPYINDEX_C2F(xxuuhi,_ga_xxuuhi, ndim);
    wnga_step_bound_info_patch(xx, _ga_xxlo, _ga_xxhi, vv, _ga_vvlo, _ga_vvhi, xxll, _ga_xxlllo, _ga_xxllhi, xxuu, _ga_xxuulo, _ga_xxuuhi , 
    boundmin,wolfemin,boundmax);
}